

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::attributeDecl(Parser *this,ptr<ObjectExpression> *descriptor,Scope scope)

{
  pointer pcVar1;
  ObjectExpression *this_00;
  bool bVar2;
  bool bVar3;
  bool constant;
  Identifier identifier;
  ptr<Expression> expr;
  ptr<Expression> local_98;
  Identifier local_88;
  TokenType local_68;
  undefined4 uStack_64;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined1 local_58 [16];
  Klex *pKStack_48;
  unsigned_long local_40;
  _Alloc_hider _Stack_38;
  
  bVar2 = match(this,Let);
  if (!bVar2) {
    bVar3 = match(this,Const);
    constant = true;
    if (!bVar3) goto LAB_0010d287;
  }
  consume(this);
  constant = bVar2;
LAB_0010d287:
  local_68 = (this->currentToken).type;
  pcVar1 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->currentToken).lexeme._M_string_length);
  local_40 = (this->currentToken).line;
  _Stack_38._M_p = (pointer)(this->currentToken).col;
  if (local_60 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8)) {
    local_88.field_2._8_8_ = pKStack_48;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)local_60;
  }
  local_88.field_2._M_allocated_capacity = local_58._8_8_;
  local_88._M_string_length = local_58._0_8_;
  consume(this,Identifier,"identifier");
  consume(this,Assign,"assignment operator \'=\'");
  expression((Parser *)&local_68);
  consume(this,StatEnd,"\';\'");
  this_00 = (descriptor->super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(uStack_64,local_68);
  local_98.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_60;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_60->_M_use_count = local_60->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_60->_M_use_count = local_60->_M_use_count + 1;
    }
  }
  ObjectExpression::putExpression(this_00,&local_88,scope,&local_98,constant);
  if (local_98.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Parser::attributeDecl(ptr<ObjectExpression> &descriptor, Scope scope) {
    bool constant = true;

    if(match(TokenType::Let)) {
        consume();
    } else if(match(TokenType::Const)) {
        constant = false;
        consume();
    }

    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier,"identifier");
    consume(TokenType::Assign, "assignment operator '='");
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");

    descriptor -> putExpression(identifier, scope, expr, constant);
}